

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3OomFault(sqlite3 *db)

{
  if ((db->mallocFailed == '\0') && (db->bBenignMalloc == '\0')) {
    db->mallocFailed = '\x01';
    if (0 < db->nVdbeExec) {
      (db->u1).isInterrupted = 1;
    }
    (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
    if (db->pParse != (Parse *)0x0) {
      db->pParse->rc = 7;
      return;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3OomFault(sqlite3 *db){
  if( db->mallocFailed==0 && db->bBenignMalloc==0 ){
    db->mallocFailed = 1;
    if( db->nVdbeExec>0 ){
      db->u1.isInterrupted = 1;
    }
    db->lookaside.bDisable++;
    if( db->pParse ){
      db->pParse->rc = SQLITE_NOMEM_BKPT;
    }
  }
}